

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::precise_unit::operator==(precise_unit *this,unit *other)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  unit *other_local;
  precise_unit *this_local;
  
  bVar2 = detail::unit_data::operator!=(&this->base_units_,&other->base_units_);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    dVar1 = this->multiplier_;
    dVar3 = unit::multiplier(other);
    if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
      this_local._7_1_ = detail::compare_round_equals((float)this->multiplier_,other->multiplier_);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const unit& other) const
    {
        if (base_units_ != other.base_units_) {
            return false;
        }
        if (multiplier_ == other.multiplier()) {
            return true;
        }
        return detail::compare_round_equals(
            static_cast<float>(multiplier_), other.multiplier_);
    }